

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOBLoader.cpp
# Opt level: O0

Texture * __thiscall
Assimp::LWOImporter::SetupNewTextureLWOB(LWOImporter *this,TextureList *list,uint size)

{
  undefined8 uVar1;
  char *pcVar2;
  Logger *this_00;
  basic_formatter *this_01;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  string local_118;
  char *local_f8;
  char *s;
  string type;
  Texture *tex;
  Texture local_b8;
  uint local_1c;
  TextureList *pTStack_18;
  uint size_local;
  TextureList *list_local;
  LWOImporter *this_local;
  
  local_1c = size;
  pTStack_18 = list;
  list_local = (TextureList *)this;
  LWO::Texture::Texture(&local_b8);
  std::__cxx11::list<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_>::push_back
            (list,&local_b8);
  LWO::Texture::~Texture(&local_b8);
  type.field_2._8_8_ =
       std::__cxx11::list<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_>::back
                 (pTStack_18);
  std::__cxx11::string::string((string *)&s);
  GetS0(this,(string *)&s,local_1c);
  local_f8 = (char *)std::__cxx11::string::c_str();
  pcVar2 = strstr(local_f8,"Image Map");
  if (pcVar2 == (char *)0x0) {
    this_00 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[35]>(&local_290,(char (*) [35])"LWOB: Unsupported legacy texture: ");
    this_01 = (basic_formatter *)
              Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
              operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                        &local_290,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&s);
    Formatter::basic_formatter::operator_cast_to_string(&local_118,this_01);
    Logger::error(this_00,&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    ~basic_formatter(&local_290);
  }
  else {
    pcVar2 = strstr(local_f8,"Planar");
    if (pcVar2 == (char *)0x0) {
      pcVar2 = strstr(local_f8,"Cylindrical");
      if (pcVar2 == (char *)0x0) {
        pcVar2 = strstr(local_f8,"Spherical");
        if (pcVar2 == (char *)0x0) {
          pcVar2 = strstr(local_f8,"Cubic");
          if (pcVar2 == (char *)0x0) {
            pcVar2 = strstr(local_f8,"Front");
            if (pcVar2 != (char *)0x0) {
              *(undefined4 *)(type.field_2._8_8_ + 0x60) = 4;
            }
          }
          else {
            *(undefined4 *)(type.field_2._8_8_ + 0x60) = 3;
          }
        }
        else {
          *(undefined4 *)(type.field_2._8_8_ + 0x60) = 2;
        }
      }
      else {
        *(undefined4 *)(type.field_2._8_8_ + 0x60) = 1;
      }
    }
    else {
      *(undefined4 *)(type.field_2._8_8_ + 0x60) = 0;
    }
  }
  uVar1 = type.field_2._8_8_;
  std::__cxx11::string::~string((string *)&s);
  return (Texture *)uVar1;
}

Assistant:

LWO::Texture* LWOImporter::SetupNewTextureLWOB(LWO::TextureList& list,unsigned int size)
{
    list.push_back(LWO::Texture());
    LWO::Texture* tex = &list.back();

    std::string type;
    GetS0(type,size);
    const char* s = type.c_str();

    if(strstr(s, "Image Map"))
    {
        // Determine mapping type
        if(strstr(s, "Planar"))
            tex->mapMode = LWO::Texture::Planar;
        else if(strstr(s, "Cylindrical"))
            tex->mapMode = LWO::Texture::Cylindrical;
        else if(strstr(s, "Spherical"))
            tex->mapMode = LWO::Texture::Spherical;
        else if(strstr(s, "Cubic"))
            tex->mapMode = LWO::Texture::Cubic;
        else if(strstr(s, "Front"))
            tex->mapMode = LWO::Texture::FrontProjection;
    }
    else
    {
        // procedural or gradient, not supported
        ASSIMP_LOG_ERROR_F("LWOB: Unsupported legacy texture: ", type);
    }

    return tex;
}